

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O3

string * __thiscall
duckdb::StringUtil::Format<unsigned_char,std::__cxx11::string>
          (string *__return_storage_ptr__,StringUtil *this,string *fmt_str,uchar params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1)

{
  long lVar1;
  undefined7 in_register_00000009;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  lVar1 = *(long *)CONCAT71(in_register_00000009,params);
  local_48[0] = local_38;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,lVar1,((long *)CONCAT71(in_register_00000009,params))[1] + lVar1);
  Exception::ConstructMessage<unsigned_char,std::__cxx11::string>
            (__return_storage_ptr__,(Exception *)this,(string *)((ulong)fmt_str & 0xffffffff),
             (uchar)local_48,params_1);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}